

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void kwsysProcessesUpdate(kwsysProcessInstances *newProcesses)

{
  undefined1 local_110 [8];
  sigset_t oldset;
  sigset_t newset;
  kwsysProcessInstances *newProcesses_local;
  
  sigemptyset((sigset_t *)(oldset.__val + 0xf));
  sigaddset((sigset_t *)(oldset.__val + 0xf),0x11);
  sigprocmask(0,(sigset_t *)(oldset.__val + 0xf),(sigset_t *)local_110);
  kwsysProcesses.Count = newProcesses->Count;
  kwsysProcesses.Size = newProcesses->Size;
  kwsysProcesses.Processes = newProcesses->Processes;
  sigprocmask(2,(sigset_t *)local_110,(sigset_t *)0x0);
  return;
}

Assistant:

static void kwsysProcessesUpdate(kwsysProcessInstances* newProcesses)
{
  /* Block SIGCHLD while we update the set of pipes to check.
     TODO: sigprocmask is undefined for threaded apps.  See
     pthread_sigmask.  */
  sigset_t newset;
  sigset_t oldset;
  sigemptyset(&newset);
  sigaddset(&newset, SIGCHLD);
  sigprocmask(SIG_BLOCK, &newset, &oldset);

  /* Store the new set in that seen by the signal handler.  */
  kwsysProcesses = *newProcesses;

  /* Restore the signal mask to the previous setting.  */
  sigprocmask(SIG_SETMASK, &oldset, 0);
}